

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intervals.cpp
# Opt level: O0

void __thiscall
IntervalsTest_TestOverlapFound_Test::TestBody(IntervalsTest_TestOverlapFound_Test *this)

{
  allocator<int> *this_00;
  initializer_list<int> __l;
  bool bVar1;
  char *message;
  AssertHelper local_d0;
  Message local_c8;
  vector<int,_std::allocator<int>_> local_c0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  int local_90 [2];
  iterator local_88;
  size_type local_80;
  undefined1 local_78 [8];
  vector<int,_std::allocator<int>_> expected;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_34 [3];
  undefined1 local_28 [8];
  vector<wasm::Interval,_std::allocator<wasm::Interval>_> intervals;
  IntervalsTest_TestOverlapFound_Test *this_local;
  
  intervals.super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<wasm::Interval,_std::allocator<wasm::Interval>_>::vector
            ((vector<wasm::Interval,_std::allocator<wasm::Interval>_> *)local_28);
  local_34[2] = 0;
  local_34[1] = 2;
  local_34[0] = 5;
  std::vector<wasm::Interval,std::allocator<wasm::Interval>>::emplace_back<int,int,int>
            ((vector<wasm::Interval,std::allocator<wasm::Interval>> *)local_28,local_34 + 2,
             local_34 + 1,local_34);
  local_48 = 1;
  local_4c = 4;
  local_50 = 10;
  std::vector<wasm::Interval,std::allocator<wasm::Interval>>::emplace_back<int,int,int>
            ((vector<wasm::Interval,std::allocator<wasm::Interval>> *)local_28,
             &stack0xffffffffffffffb8,&stack0xffffffffffffffb4,&stack0xffffffffffffffb0);
  local_54 = 4;
  local_58 = 5;
  expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0xf;
  std::vector<wasm::Interval,std::allocator<wasm::Interval>>::emplace_back<int,int,int>
            ((vector<wasm::Interval,std::allocator<wasm::Interval>> *)local_28,
             &stack0xffffffffffffffac,&stack0xffffffffffffffa8,
             (int *)((long)&expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4));
  local_90[0] = 1;
  local_90[1] = 2;
  local_88 = local_90;
  local_80 = 2;
  this_00 = (allocator<int> *)
            ((long)&gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 7);
  std::allocator<int>::allocator(this_00);
  __l._M_len = local_80;
  __l._M_array = local_88;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_78,__l,this_00);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  ::wasm::IntervalProcessor::filterOverlaps((vector *)&local_c0);
  testing::internal::EqHelper::
  Compare<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_nullptr>
            ((EqHelper *)local_a8,"IntervalProcessor::filterOverlaps(intervals)","expected",
             &local_c0,(vector<int,_std::allocator<int>_> *)local_78);
  std::vector<int,_std::allocator<int>_>::~vector(&local_c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/intervals.cpp"
               ,0x22,message);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_78);
  std::vector<wasm::Interval,_std::allocator<wasm::Interval>_>::~vector
            ((vector<wasm::Interval,_std::allocator<wasm::Interval>_> *)local_28);
  return;
}

Assistant:

TEST(IntervalsTest, TestOverlapFound) {
  std::vector<Interval> intervals;
  intervals.emplace_back(0, 2, 5);
  intervals.emplace_back(1, 4, 10);
  intervals.emplace_back(4, 5, 15);
  std::vector<int> expected{1, 2};
  ASSERT_EQ(IntervalProcessor::filterOverlaps(intervals), expected);
}